

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::LogMessage::LogMessage
          (LogMessage *this,Level level,string *file,LineNumber line,string *func,
          VerboseLevel verboseLevel,Logger *logger)

{
  VerboseLevel verboseLevel_local;
  string *func_local;
  LineNumber line_local;
  string *file_local;
  Level level_local;
  LogMessage *this_local;
  
  this->m_level = level;
  std::__cxx11::string::string((string *)&this->m_file,(string *)file);
  this->m_line = line;
  std::__cxx11::string::string((string *)&this->m_func,(string *)func);
  this->m_verboseLevel = verboseLevel;
  this->m_logger = logger;
  Logger::stream_abi_cxx11_(logger);
  std::__cxx11::stringstream::str();
  return;
}

Assistant:

LogMessage(Level level, const std::string& file, base::type::LineNumber line, const std::string& func,
             base::type::VerboseLevel verboseLevel, Logger* logger) :
    m_level(level), m_file(file), m_line(line), m_func(func),
    m_verboseLevel(verboseLevel), m_logger(logger), m_message(logger->stream().str()) {
  }